

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BinaryOpCase::logSingleOperationCalculationInfo
          (BinaryOpCase *this)

{
  string *__lhs;
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  MessageBuilder local_190;
  
  __lhs = &this->m_op;
  bVar1 = std::operator==(__lhs,"+");
  if (bVar1) {
    pcVar2 = "addition";
  }
  else {
    bVar1 = std::operator==(__lhs,"-");
    if (bVar1) {
      pcVar2 = "subtraction";
    }
    else {
      bVar1 = std::operator==(__lhs,"*");
      if (bVar1) {
        pcVar2 = "multiplication";
      }
      else {
        bVar1 = std::operator==(__lhs,"/");
        pcVar2 = (char *)0x0;
        if (bVar1) {
          pcVar2 = "division";
        }
      }
    }
  }
  local_190.m_log =
       ((this->super_OperatorPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Note: the bigger program contains ");
  std::ostream::operator<<(this_00,0x10);
  std::operator<<((ostream *)this_00," more ");
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00," operations in one loop iteration than the small program; ");
  std::operator<<((ostream *)this_00,
                  "cost of one operation is calculated as (cost_of_bigger_workload - cost_of_smaller_workload) / "
                 );
  std::ostream::operator<<(this_00,0x10);
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void BinaryOpCase::logSingleOperationCalculationInfo (void) const
{
	const int			baseNumOpsInsideLoop			= 2 * BINARY_OPERATOR_CASE_NUM_INDEPENDENT_CALCULATIONS;
	const int			numOpsInsideLoopInSmallProgram	= baseNumOpsInsideLoop * BINARY_OPERATOR_CASE_SMALL_PROGRAM_UNROLL_AMOUNT;
	const int			numOpsInsideLoopInBigProgram	= baseNumOpsInsideLoop * BINARY_OPERATOR_CASE_BIG_PROGRAM_UNROLL_AMOUNT;
	const int			opDiff							= numOpsInsideLoopInBigProgram - numOpsInsideLoopInSmallProgram;
	const char* const	opName							= m_op == "+" ? "addition"
														: m_op == "-" ? "subtraction"
														: m_op == "*" ? "multiplication"
														: m_op == "/" ? "division"
														: DE_NULL;
	DE_ASSERT(opName != DE_NULL);

	m_testCtx.getLog() << TestLog::Message << "Note: the bigger program contains " << opDiff << " more "
										   << opName << " operations in one loop iteration than the small program; "
										   << "cost of one operation is calculated as (cost_of_bigger_workload - cost_of_smaller_workload) / " << opDiff
										   << TestLog::EndMessage;
}